

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

size_t __thiscall flexbuffers::Builder::EndVector(Builder *this,size_t start,bool typed,bool fixed)

{
  pointer *ppVVar1;
  iterator __position;
  Value vec;
  anon_union_8_3_83789bcb_for_Value_0 local_28;
  undefined8 uStack_20;
  
  _local_28 = CreateVector(this,start,
                           ((long)(this->stack_).
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->stack_).
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) - start,1,typed,
                           fixed,(Value *)0x0);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::resize
            (&this->stack_,start);
  __position._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<flexbuffers::Builder::Value,std::allocator<flexbuffers::Builder::Value>>::
    _M_realloc_insert<flexbuffers::Builder::Value_const&>
              ((vector<flexbuffers::Builder::Value,std::allocator<flexbuffers::Builder::Value>> *)
               &this->stack_,__position,(Value *)&local_28);
  }
  else {
    ((__position._M_current)->field_0).i_ = (int64_t)local_28;
    (__position._M_current)->type_ = (undefined4)uStack_20;
    (__position._M_current)->min_bit_width_ = uStack_20._4_4_;
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return local_28.i_;
}

Assistant:

size_t EndVector(size_t start, bool typed, bool fixed) {
    auto vec = CreateVector(start, stack_.size() - start, 1, typed, fixed);
    // Remove temp elements and return vector.
    stack_.resize(start);
    stack_.push_back(vec);
    return static_cast<size_t>(vec.u_);
  }